

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     handle_float_type_spec<fmt::v5::internal::float_type_checker<fmt::v5::internal::error_handler>>
               (char spec,float_type_checker<fmt::v5::internal::error_handler> *handler)

{
  float_type_checker<fmt::v5::internal::error_handler> *in_RSI;
  char in_DIL;
  
  if (in_DIL != '\0') {
    if (in_DIL == 'A') {
LAB_0022546b:
      float_type_checker<fmt::v5::internal::error_handler>::on_hex(in_RSI);
      return;
    }
    if (in_DIL == 'E') {
LAB_00225453:
      float_type_checker<fmt::v5::internal::error_handler>::on_exp(in_RSI);
      return;
    }
    if (in_DIL == 'F') {
LAB_0022545f:
      float_type_checker<fmt::v5::internal::error_handler>::on_fixed(in_RSI);
      return;
    }
    if (in_DIL != 'G') {
      if (in_DIL == 'a') goto LAB_0022546b;
      if (in_DIL == 'e') goto LAB_00225453;
      if (in_DIL == 'f') goto LAB_0022545f;
      if (in_DIL != 'g') {
        float_type_checker<fmt::v5::internal::error_handler>::on_error
                  ((float_type_checker<fmt::v5::internal::error_handler> *)0x225481);
        return;
      }
    }
  }
  float_type_checker<fmt::v5::internal::error_handler>::on_general(in_RSI);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_float_type_spec(char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'g': case 'G':
    handler.on_general();
    break;
  case 'e': case 'E':
    handler.on_exp();
    break;
  case 'f': case 'F':
    handler.on_fixed();
    break;
   case 'a': case 'A':
    handler.on_hex();
    break;
  default:
    handler.on_error();
    break;
  }
}